

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ufiber.hpp
# Opt level: O3

return_type
boost::asio::
async_result<ufiber::yield_token<boost::asio::io_context::basic_executor_type<std::allocator<void>,0u>>,void()>
::
initiate<boost::asio::detail::initiate_post,ufiber::yield_token<boost::asio::io_context::basic_executor_type<std::allocator<void>,0u>>&>
          (initiate_post *op,
          yield_token<boost::asio::io_context::basic_executor_type<std::allocator<void>,_0U>_>
          *token)

{
  undefined8 *puVar1;
  promise<> promise;
  completion_handler_type handler;
  int local_3c;
  completion_handler_type local_38;
  anon_class_16_2_08e66f54 local_18;
  
  local_38.promise_._M_t.super___uniq_ptr_impl<void,_ufiber::detail::fiber_context::resumer>._M_t.
  super__Tuple_impl<0UL,_void_*,_ufiber::detail::fiber_context::resumer>.
  super__Head_base<0UL,_void_*,_false>._M_head_impl = &local_3c;
  local_3c = 0;
  local_38.promise_._M_t.super___uniq_ptr_impl<void,_ufiber::detail::fiber_context::resumer>._M_t.
  super__Tuple_impl<0UL,_void_*,_ufiber::detail::fiber_context::resumer>.
  super__Tuple_impl<1UL,_ufiber::detail::fiber_context::resumer>.
  super__Head_base<1UL,_ufiber::detail::fiber_context::resumer,_false>._M_head_impl.ctx_ =
       (_Head_base<1UL,_ufiber::detail::fiber_context::resumer,_false>)token->ctx_;
  local_18.handler = &local_38;
  local_38.executor_.io_context_ = (token->executor_).io_context_;
  local_38.executor_.bits_ = (token->executor_).bits_;
  local_18.op = op;
  ufiber::detail::fiber_context::
  suspend_with<boost::asio::async_result<ufiber::yield_token<boost::asio::io_context::basic_executor_type<std::allocator<void>,0u>>,void()>::initiate<boost::asio::detail::initiate_post,ufiber::yield_token<boost::asio::io_context::basic_executor_type<std::allocator<void>,0u>>&>(boost::asio::detail::initiate_post&&,ufiber::yield_token<boost::asio::io_context::basic_executor_type<std::allocator<void>,0u>>&)::_lambda()_1_>
            ((fiber_context *)
             local_38.promise_._M_t.
             super___uniq_ptr_impl<void,_ufiber::detail::fiber_context::resumer>._M_t.
             super__Tuple_impl<0UL,_void_*,_ufiber::detail::fiber_context::resumer>.
             super__Tuple_impl<1UL,_ufiber::detail::fiber_context::resumer>.
             super__Head_base<1UL,_ufiber::detail::fiber_context::resumer,_false>._M_head_impl.ctx_,
             &local_18);
  if (local_3c == 1) {
    std::unique_ptr<void,_ufiber::detail::fiber_context::resumer>::~unique_ptr(&local_38.promise_);
    return;
  }
  puVar1 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar1 = &PTR__exception_0010eb80;
  __cxa_throw(puVar1,&ufiber::broken_promise::typeinfo,std::exception::~exception);
}

Assistant:

static return_type initiate(Op&& op, Token&& token, Ts&&... ts)
    {
        ::ufiber::detail::promise<Args...> promise;
        ::ufiber::detail::fiber_context& ctx =
          ::ufiber::detail::get_fiber(token);
        completion_handler_type handler{&promise, token, ctx};
        ctx.suspend_with([&]() noexcept {
            op(std::move(handler), std::forward<Ts>(ts)...);
        });
        return promise.get_value();
    }